

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-util.cc
# Opt level: O3

string * tinyusdz::io::JoinPath(string *__return_storage_ptr__,string *dir,string *filename)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  pointer pcVar7;
  bool bVar8;
  string basedir;
  long *local_90;
  ulong local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  if (dir->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (filename->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar7,pcVar7 + filename->_M_string_length);
    return __return_storage_ptr__;
  }
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  if ((dir->_M_dataplus)._M_p[dir->_M_string_length - 1] == '/') {
    ::std::__cxx11::string::_M_assign((string *)&local_50);
  }
  else {
    local_70 = local_60;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
    plVar4 = (long *)::std::__cxx11::string::replace
                               ((ulong)&local_70,0,(char *)0x0,(ulong)(dir->_M_dataplus)._M_p);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
  }
  if (local_48 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = (filename->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar7,pcVar7 + filename->_M_string_length);
    goto LAB_002bd8c0;
  }
  local_90 = &local_80;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"./","");
  plVar4 = local_90;
  if (filename->_M_string_length < local_88) {
    bVar8 = false;
  }
  else if (local_88 == 0) {
    bVar8 = true;
  }
  else {
    iVar3 = bcmp(local_90,(filename->_M_dataplus)._M_p,local_88);
    bVar8 = iVar3 == 0;
  }
  if (plVar4 != &local_80) {
    operator_delete(plVar4,local_80 + 1);
  }
  if (!bVar8) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(filename->_M_dataplus)._M_p);
    goto LAB_002bd8c0;
  }
  local_70 = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"./","");
  uVar1 = filename->_M_string_length;
  if (uVar1 < local_68) {
    pcVar7 = (filename->_M_dataplus)._M_p;
LAB_002bd7fd:
    local_90 = &local_80;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar7,pcVar7 + uVar1);
  }
  else {
    if (local_68 != 0) {
      pcVar7 = (filename->_M_dataplus)._M_p;
      iVar3 = bcmp(local_70,pcVar7,local_68);
      if (iVar3 != 0) goto LAB_002bd7fd;
    }
    ::std::__cxx11::string::substr((ulong)&local_90,(ulong)filename);
  }
  plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
LAB_002bd8c0:
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinPath(const std::string &dir, const std::string &filename) {
  if (dir.empty()) {
    return filename;
  } else {
    // check '/'
    char lastChar = *dir.rbegin();

    // TODO: Support more relative path case.

    std::string basedir;
    if (lastChar != '/') {
      basedir = dir + std::string("/");
    } else {
      basedir = dir;
    }

    if (basedir.size()) {
      if (startsWith(filename, "./")) {
        // strip "./"
        return basedir + removePrefix(filename, "./");
      }
      return basedir + filename;
    } else {
      return filename;
    }
  }
}